

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O3

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)0>::butterfly_radix8<256l>
          (fft<float,2048l,(re::fft::direction)0> *this,span<std::complex<float>,_256L> out)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  puVar5 = (undefined8 *)((long)out.storage_.data_ + 0x708);
  lVar2 = 0x40;
  lVar3 = 0x60;
  lVar4 = 0x50;
  lVar6 = 0x70;
  do {
    fVar9 = (float)puVar5[-0xc0];
    fVar8 = (float)((ulong)puVar5[-0xc0] >> 0x20);
    fVar10 = (float)*(undefined8 *)(this + lVar2 * 4);
    fVar7 = (float)((ulong)*(undefined8 *)(this + lVar2 * 4) >> 0x20);
    puVar5[-0xc0] = CONCAT44(fVar9 * fVar7 + fVar10 * fVar8,fVar9 * fVar10 + fVar7 * -fVar8);
    fVar9 = (float)((ulong)puVar5[-0xa0] >> 0x20);
    fVar10 = (float)puVar5[-0xa0];
    fVar8 = (float)*(undefined8 *)(this + lVar2 * 2);
    fVar26 = (float)((ulong)*(undefined8 *)(this + lVar2 * 2) >> 0x20);
    fVar7 = fVar10 * fVar8 + fVar26 * -fVar9;
    fVar8 = fVar10 * fVar26 + fVar8 * fVar9;
    puVar5[-0xa0] = CONCAT44(fVar8,fVar7);
    fVar26 = (float)((ulong)puVar5[-0x80] >> 0x20);
    fVar10 = (float)puVar5[-0x80];
    fVar11 = (float)*(undefined8 *)(this + lVar3 * 4);
    fVar12 = (float)((ulong)*(undefined8 *)(this + lVar3 * 4) >> 0x20);
    fVar9 = fVar10 * fVar11 + fVar12 * -fVar26;
    fVar10 = fVar10 * fVar12 + fVar11 * fVar26;
    puVar5[-0x80] = CONCAT44(fVar10,fVar9);
    fVar12 = (float)puVar5[-0x60];
    fVar14 = (float)((ulong)puVar5[-0x60] >> 0x20);
    fVar26 = (float)*(undefined8 *)(this + lVar2);
    fVar11 = (float)((ulong)*(undefined8 *)(this + lVar2) >> 0x20);
    fVar13 = fVar12 * fVar26 + fVar11 * -fVar14;
    fVar14 = fVar12 * fVar11 + fVar26 * fVar14;
    puVar5[-0x60] = CONCAT44(fVar14,fVar13);
    fVar12 = (float)puVar5[-0x40];
    fVar15 = (float)((ulong)puVar5[-0x40] >> 0x20);
    fVar26 = (float)*(undefined8 *)(this + lVar4 * 4);
    fVar11 = (float)((ulong)*(undefined8 *)(this + lVar4 * 4) >> 0x20);
    fVar23 = fVar12 * fVar26 + fVar11 * -fVar15;
    fVar24 = fVar12 * fVar11 + fVar26 * fVar15;
    puVar5[-0x40] = CONCAT44(fVar24,fVar23);
    fVar12 = (float)puVar5[-0x20];
    fVar15 = (float)((ulong)puVar5[-0x20] >> 0x20);
    fVar26 = (float)*(undefined8 *)(this + lVar3 * 2);
    fVar11 = (float)((ulong)*(undefined8 *)(this + lVar3 * 2) >> 0x20);
    fVar17 = fVar12 * fVar26 + fVar11 * -fVar15;
    fVar18 = fVar12 * fVar11 + fVar26 * fVar15;
    puVar5[-0x20] = CONCAT44(fVar18,fVar17);
    uVar1 = *(undefined8 *)(this + lVar6 * 4);
    fVar11 = (float)puVar5[-0xe0];
    fVar12 = (float)((ulong)puVar5[-0xe0] >> 0x20);
    fVar26 = (float)puVar5[-0xc0];
    fVar15 = fVar11 + fVar26;
    fVar19 = (float)((ulong)puVar5[-0xc0] >> 0x20);
    fVar16 = fVar12 + fVar19;
    fVar11 = fVar11 - fVar26;
    fVar12 = fVar12 - fVar19;
    puVar5[-0xe0] = CONCAT44(fVar16,fVar15);
    puVar5[-0xc0] = CONCAT44(fVar12,fVar11);
    fVar21 = fVar7 + fVar9;
    fVar22 = fVar8 + fVar10;
    puVar5[-0xa0] = CONCAT44(fVar22,fVar21);
    fVar19 = fVar13 + fVar23;
    fVar20 = fVar14 + fVar24;
    fVar13 = fVar13 - fVar23;
    fVar14 = fVar14 - fVar24;
    puVar5[-0x60] = CONCAT44(fVar20,fVar19);
    puVar5[-0x40] = CONCAT44(fVar14,fVar13);
    fVar26 = (float)*puVar5;
    fVar23 = (float)((ulong)*puVar5 >> 0x20);
    fVar24 = (float)uVar1;
    fVar27 = (float)((ulong)uVar1 >> 0x20);
    fVar25 = fVar26 * fVar24 + fVar27 * -fVar23;
    fVar26 = fVar26 * fVar27 + fVar24 * fVar23;
    fVar23 = fVar17 + fVar25;
    fVar24 = fVar18 + fVar26;
    fVar17 = fVar17 - fVar25;
    fVar18 = fVar18 - fVar26;
    puVar5[-0x20] = CONCAT44(fVar24,fVar23);
    *puVar5 = CONCAT44(fVar18,fVar17);
    fVar7 = fVar7 - fVar9;
    fVar8 = fVar8 - fVar10;
    puVar5[-0x80] = CONCAT44(fVar7,fVar8) ^ 0x8000000000000000;
    fVar10 = (float)*(undefined8 *)(this + 0x100);
    fVar26 = (float)((ulong)*(undefined8 *)(this + 0x100) >> 0x20);
    fVar9 = fVar26 * -fVar14 + fVar13 * fVar10;
    fVar10 = fVar10 * fVar14 + fVar13 * fVar26;
    puVar5[-0x40] = CONCAT44(fVar10,fVar9);
    fVar26 = (float)*(undefined8 *)(this + 0x100);
    fVar13 = (float)((ulong)*(undefined8 *)(this + 0x100) >> 0x20);
    fVar14 = fVar17 * fVar13 + fVar18 * fVar26;
    fVar17 = fVar17 * fVar26 + -fVar18 * fVar13;
    fVar26 = fVar9 + fVar14;
    fVar13 = fVar10 + fVar17;
    fVar9 = fVar9 - fVar14;
    fVar10 = fVar10 - fVar17;
    puVar5[-0xe0] = CONCAT44(fVar16 + fVar22 + fVar20 + fVar24,fVar15 + fVar21 + fVar19 + fVar23);
    puVar5[-0x60] =
         CONCAT44((fVar16 + fVar22) - (fVar20 + fVar24),(fVar15 + fVar21) - (fVar19 + fVar23));
    puVar5[-0xc0] = CONCAT44((fVar12 - fVar7) + fVar10,fVar11 + fVar8 + fVar26);
    puVar5[-0x40] = CONCAT44((fVar12 - fVar7) - fVar10,(fVar11 + fVar8) - fVar26);
    puVar5[-0xa0] =
         CONCAT44((fVar16 - fVar22) - (fVar19 - fVar23),(fVar15 - fVar21) + (fVar20 - fVar24));
    puVar5[-0x20] =
         CONCAT44((fVar16 - fVar22) + (fVar19 - fVar23),(fVar15 - fVar21) - (fVar20 - fVar24));
    puVar5[-0x80] = CONCAT44((fVar12 + fVar7) - fVar9,(fVar11 - fVar8) + fVar13);
    *puVar5 = CONCAT44(fVar9 + fVar12 + fVar7,(fVar11 - fVar8) - fVar13);
    puVar5 = puVar5 + 1;
    lVar2 = lVar2 + 0x40;
    lVar3 = lVar3 + 0x60;
    lVar4 = lVar4 + 0x50;
    lVar6 = lVar6 + 0x70;
  } while (lVar2 != 0x800);
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }